

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_Diag
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  complex<float> *this_00;
  int iVar3;
  long col;
  long lVar4;
  int extraout_var_00;
  
  lVar2 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar3 = 0;
  if ((lVar2 == CONCAT44(extraout_var,iVar1)) &&
     ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed == '\x04')) {
    iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    lVar2 = CONCAT44(extraout_var_00,iVar1);
    iVar3 = 1;
    if (lVar2 != 0) {
      col = 0;
      if (lVar2 == 0 || extraout_var_00 < 0) {
        lVar2 = col;
      }
      for (; col < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
          col = col + 1) {
        this_00 = TPZFMatrix<std::complex<float>_>::operator()(B,0,col);
        for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
          std::complex<float>::operator/=(this_00,(this->fElem).fStore[lVar4]);
          this_00 = this_00 + 1;
        }
      }
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ELDLt) return( 0 );
    int64_t dimension = this->Dim();
    if (!dimension) {
        return 1;
    }
    for ( int64_t j = 0; j < B->Cols(); j++ ) {
        TVar *BPtr = &(*B)(0,j);
        int64_t k=0;
        while(k < dimension) *BPtr++ /= *(fElem[k++]);
    }
    return( 1 );
}